

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O1

void SingleTreeSearchHelper
               (ON_RTreeNode *a_nodeA,ON_RTreeNode *a_nodeB,ON_RTreePairSearchResult *a_result)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  ON_2dex *pOVar4;
  int *piVar5;
  anon_union_8_2_fca59aa2_for_ON_RTreeBranch_1 *paVar6;
  ON_RTreeBranch *a_branchA;
  
  a_branchA = a_nodeA->m_branch;
  iVar1 = a_nodeA->m_count;
  iVar2 = a_nodeB->m_count;
  if ((a_nodeA->m_level < 1) && (a_nodeB->m_level < 1)) {
    if (0 < iVar1) {
      do {
        paVar6 = &a_nodeB->m_branch[0].field_1;
        if (0 < iVar2) {
          do {
            if ((a_branchA < (ON_RTreeBranch *)(paVar6 + -6)) &&
               (bVar3 = PairSearchOverlapHelper
                                  (&a_branchA->m_rect,(ON_RTreeBBox *)(paVar6 + -6),
                                   a_result->m_tolerance), bVar3)) {
              pOVar4 = ON_SimpleArray<ON_2dex>::AppendNew(a_result->m_result);
              pOVar4->i = *(int *)&a_branchA->field_1;
              pOVar4->j = *(int *)paVar6;
            }
            piVar5 = (int *)(paVar6 + 1);
            paVar6 = paVar6 + 7;
          } while (piVar5 < a_nodeB->m_branch + iVar2);
        }
        a_branchA = a_branchA + 1;
      } while (a_branchA < a_nodeA->m_branch + iVar1);
    }
  }
  else if (a_nodeA < &a_nodeA->m_branch[(long)iVar1 + -1].field_1) {
    do {
      paVar6 = &a_nodeB->m_branch[0].field_1;
      if (a_nodeB < &a_nodeB->m_branch[(long)iVar2 + -1].field_1) {
        do {
          bVar3 = PairSearchOverlapHelper
                            (&a_branchA->m_rect,(ON_RTreeBBox *)(paVar6 + -6),a_result->m_tolerance)
          ;
          if (bVar3) {
            if (a_nodeA->m_level < 1) {
              SingleTreeSearchHelper(a_branchA,paVar6->m_child,a_result);
            }
            else if (a_nodeB->m_level < 1) {
              SingleTreeSearchHelper
                        ((a_branchA->field_1).m_child,(ON_RTreeBranch *)(paVar6 + -6),a_result);
            }
            else {
              SingleTreeSearchHelper((a_branchA->field_1).m_child,paVar6->m_child,a_result);
            }
          }
          piVar5 = (int *)(paVar6 + 1);
          paVar6 = paVar6 + 7;
        } while (piVar5 < a_nodeB->m_branch + iVar2);
      }
      a_branchA = a_branchA + 1;
    } while (a_branchA < a_nodeA->m_branch + iVar1);
  }
  return;
}

Assistant:

static void SingleTreeSearchHelper(const ON_RTreeNode* a_nodeA, const ON_RTreeNode* a_nodeB, ON_RTreePairSearchResult* a_result)
{
  // DO NOT ADD ANYTHING TO THIS FUNCTION
  const ON_RTreeBranch *branchA, *branchAmax, *branchB, *branchBmax;

  branchA = a_nodeA->m_branch;
  branchAmax = branchA + a_nodeA->m_count;
  branchBmax = a_nodeB->m_branch + a_nodeB->m_count;

  if (a_nodeA->m_level > 0 || a_nodeB->m_level > 0)
  {
    while (branchA < branchAmax)
    {
      for (branchB = a_nodeB->m_branch; branchB < branchBmax; branchB++)
      {
        if (PairSearchOverlapHelper(&branchA->m_rect, &branchB->m_rect, a_result->m_tolerance))
        {
          if (a_nodeA->m_level > 0)
          {
            if (a_nodeB->m_level > 0)
              SingleTreeSearchHelper(branchA->m_child, branchB->m_child, a_result);
            else
              SingleTreeSearchHelper(branchA->m_child, branchB, a_result);
          }
          else // a_nodeB->m_level > 0
          {
            SingleTreeSearchHelper(branchA, branchB->m_child, a_result);
          }
        }
      }
      branchA++;
    }
  }
  else
  {
    while (branchA < branchAmax)
    {
      for (branchB = a_nodeB->m_branch; branchB < branchBmax; branchB++)
      {
        // branchA and branchB are leaf nodes in the same same tree.
        // Don't test pairs twice and don't test a node against itself.
        if (branchA < branchB)
        {
          if (PairSearchOverlapHelper(&branchA->m_rect, &branchB->m_rect, a_result->m_tolerance))
          {
            ON_2dex& r = a_result->m_result->AppendNew();
            r.i = (int)branchA->m_id;
            r.j = (int)branchB->m_id;
          }
        }
      }
      branchA++;
    }
  }

}